

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O0

void __thiscall
llm_build_jais::llm_build_jais
          (llm_build_jais *this,llama_model *model,llm_graph_params *params,ggml_cgraph *gf)

{
  uint32_t uVar1;
  ggml_tensor *pgVar2;
  llm_graph_context *plVar3;
  ggml_tensor *pgVar4;
  const_reference pvVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  ggml_cgraph *gf_00;
  ggml_tensor *pgVar10;
  llama_hparams *wo_b;
  ggml_tensor *down_b;
  ggml_tensor *down;
  pointer plVar11;
  llm_graph_cb *in_RCX;
  ulong uVar12;
  long in_RSI;
  long in_RDI;
  ggml_tensor *ffn_inp;
  ggml_tensor *inp_out_ids;
  ggml_tensor *Vcur;
  ggml_tensor *Kcur;
  ggml_tensor *Qcur;
  int il;
  llm_graph_input_attn_kv_unified *inp_attn;
  ggml_tensor *inpL;
  ggml_tensor *cur;
  int64_t n_embd_gqa;
  int64_t n_embd_head;
  ggml_tensor *in_stack_fffffffffffffda8;
  int iVar13;
  llama_hparams *in_stack_fffffffffffffdb0;
  ggml_tensor *in_stack_fffffffffffffdb8;
  ggml_tensor *pgVar14;
  ggml_tensor *in_stack_fffffffffffffdc0;
  ggml_tensor *pgVar15;
  ggml_tensor *in_stack_fffffffffffffdc8;
  undefined4 uVar17;
  ggml_tensor *pgVar16;
  llm_graph_context *in_stack_fffffffffffffdd0;
  ggml_tensor *in_stack_fffffffffffffe00;
  ggml_tensor *in_stack_fffffffffffffe08;
  llm_graph_context *in_stack_fffffffffffffe10;
  llm_graph_context *in_stack_fffffffffffffe50;
  ggml_tensor *gate_b;
  ggml_tensor *in_stack_fffffffffffffe80;
  ggml_tensor *in_stack_fffffffffffffe88;
  ggml_tensor *in_stack_fffffffffffffe90;
  llm_ffn_gate_type type_gate;
  int il_00;
  llm_graph_cb *plVar18;
  ggml_tensor *in_stack_fffffffffffffeb8;
  llm_graph_context *in_stack_fffffffffffffec0;
  ggml_tensor *in_stack_ffffffffffffff70;
  float kq_scale;
  ggml_tensor *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff98;
  int iVar19;
  llm_graph_context *this_00;
  ggml_tensor *local_58;
  ggml_tensor *in_stack_ffffffffffffffb8;
  ggml_tensor *in_stack_ffffffffffffffc0;
  
  llm_graph_context::llm_graph_context
            ((llm_graph_context *)in_stack_fffffffffffffdc0,
             (llm_graph_params *)in_stack_fffffffffffffdb8);
  uVar12 = (ulong)*(uint *)(*(long *)(in_RDI + 8) + 0x24);
  uVar1 = llama_hparams::n_embd_v_gqa
                    (in_stack_fffffffffffffdb0,(uint32_t)((ulong)in_stack_fffffffffffffda8 >> 0x20))
  ;
  pgVar2 = (ggml_tensor *)(ulong)uVar1;
  if (uVar12 != *(uint *)(*(long *)(in_RDI + 8) + 0x20)) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
               ,0x29ee,"GGML_ASSERT(%s) failed","n_embd_head == hparams.n_embd_head_k");
  }
  local_58 = llm_graph_context::build_inp_embd(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  plVar3 = (llm_graph_context *)
           llm_graph_context::build_attn_inp_kv_unified(in_stack_fffffffffffffe50);
  for (iVar19 = 0; iVar13 = (int)((ulong)in_stack_fffffffffffffda8 >> 0x20),
      kq_scale = (float)((ulong)in_stack_ffffffffffffff70 >> 0x20),
      (long)iVar19 < *(long *)(in_RDI + 0x28); iVar19 = iVar19 + 1) {
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)iVar19);
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)iVar19);
    llm_graph_context::build_norm
              (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
               in_stack_fffffffffffffdb8,(llm_norm_type)((ulong)in_stack_fffffffffffffdb0 >> 0x20),
               (int)in_stack_fffffffffffffdb0);
    uVar17 = (undefined4)((ulong)in_stack_fffffffffffffdc8 >> 0x20);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
               &in_stack_fffffffffffffdb0->vocab_only,iVar13);
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)iVar19);
    pgVar4 = llm_graph_context::build_lora_mm
                       (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                        in_stack_fffffffffffffe00);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
               &in_stack_fffffffffffffdb0->vocab_only,iVar13);
    uVar9 = *(undefined8 *)(in_RDI + 0xc0);
    pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)iVar19);
    pgVar4 = (ggml_tensor *)ggml_add(uVar9,pgVar4,pvVar5->bqkv);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
               &in_stack_fffffffffffffdb0->vocab_only,iVar13);
    uVar9 = *(undefined8 *)(in_RDI + 0xc0);
    uVar6 = ggml_view_2d(uVar9,pgVar4,*(undefined8 *)(in_RDI + 0x20),(long)*(int *)(in_RDI + 0xa8),
                         pgVar4->nb[1],0);
    uVar6 = ggml_cont(uVar9,uVar6);
    uVar9 = *(undefined8 *)(in_RDI + 0xc0);
    uVar7 = ggml_view_2d(uVar9,pgVar4,pgVar2,(long)*(int *)(in_RDI + 0xa8),pgVar4->nb[1],
                         pgVar4->nb[0] * *(long *)(in_RDI + 0x20));
    uVar7 = ggml_cont(uVar9,uVar7);
    uVar9 = *(undefined8 *)(in_RDI + 0xc0);
    uVar8 = ggml_view_2d();
    uVar9 = ggml_cont(uVar9,uVar8);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
               &in_stack_fffffffffffffdb0->vocab_only,iVar13);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
               &in_stack_fffffffffffffdb0->vocab_only,iVar13);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
               &in_stack_fffffffffffffdb0->vocab_only,iVar13);
    gf_00 = (ggml_cgraph *)
            ggml_reshape_3d(*(undefined8 *)(in_RDI + 0xc0),uVar6,uVar12,
                            *(undefined8 *)(in_RDI + 0x48),(long)*(int *)(in_RDI + 0xa8));
    pgVar10 = (ggml_tensor *)
              ggml_reshape_3d(*(undefined8 *)(in_RDI + 0xc0),uVar7,uVar12,
                              *(undefined8 *)(in_RDI + 0x50),(long)*(int *)(in_RDI + 0xa8));
    wo_b = (llama_hparams *)
           ggml_reshape_3d(*(undefined8 *)(in_RDI + 0xc0),uVar9,uVar12,
                           *(undefined8 *)(in_RDI + 0x50),(long)*(int *)(in_RDI + 0xa8));
    plVar18 = in_RCX;
    this_00 = plVar3;
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)iVar19);
    il_00 = (int)plVar18;
    type_gate = (llm_ffn_gate_type)plVar3;
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)iVar19);
    pgVar16 = (ggml_tensor *)CONCAT44(uVar17,iVar19);
    pgVar15 = (ggml_tensor *)0x0;
    pgVar14 = (ggml_tensor *)0x0;
    pgVar4 = llm_graph_context::build_attn
                       (this_00,(llm_graph_input_attn_kv_unified *)
                                CONCAT44(iVar19,in_stack_ffffffffffffff98),gf_00,pgVar10,
                        (ggml_tensor *)wo_b,in_stack_ffffffffffffff78,pgVar4,
                        in_stack_ffffffffffffffb8,in_stack_ffffffffffffffc0,pgVar2,kq_scale,
                        (int)uVar12);
    iVar13 = (int)((ulong)pgVar10 >> 0x20);
    plVar3 = this_00;
    if ((long)iVar19 == *(long *)(in_RDI + 0x28) + -1) {
      in_stack_fffffffffffffe90 =
           llm_graph_context::build_inp_out_ids((llm_graph_context *)in_stack_fffffffffffffe00);
      in_stack_ffffffffffffff78 = in_stack_fffffffffffffe90;
      in_stack_fffffffffffffe88 =
           (ggml_tensor *)
           ggml_get_rows(*(undefined8 *)(in_RDI + 0xc0),pgVar4,in_stack_fffffffffffffe90);
      pgVar4 = in_stack_fffffffffffffe88;
      in_stack_fffffffffffffe80 =
           (ggml_tensor *)
           ggml_get_rows(*(undefined8 *)(in_RDI + 0xc0),local_58,in_stack_ffffffffffffff78);
      plVar3 = this_00;
      local_58 = in_stack_fffffffffffffe80;
    }
    down_b = (ggml_tensor *)ggml_add(*(undefined8 *)(in_RDI + 0xc0),pgVar4,local_58);
    gate_b = down_b;
    llm_graph_context::cb((llm_graph_context *)pgVar15,pgVar14,&wo_b->vocab_only,iVar13);
    in_stack_ffffffffffffff70 = gate_b;
    pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)iVar19);
    pgVar4 = pvVar5->ffn_norm;
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)iVar19);
    down = llm_graph_context::build_norm
                     (in_stack_fffffffffffffdd0,pgVar16,pgVar15,pgVar14,
                      (llm_norm_type)((ulong)wo_b >> 0x20),(int)wo_b);
    pgVar16 = down;
    llm_graph_context::cb((llm_graph_context *)pgVar15,pgVar14,&wo_b->vocab_only,iVar13);
    pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)iVar19);
    pgVar10 = pvVar5->ffn_up;
    pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)iVar19);
    pgVar14 = pvVar5->ffn_up_b;
    pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)iVar19);
    pgVar15 = pvVar5->ffn_gate;
    pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)iVar19);
    in_stack_fffffffffffffda8 = pvVar5->ffn_gate_b;
    pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)iVar19);
    in_stack_fffffffffffffdb8 = pvVar5->ffn_down;
    pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)iVar19);
    in_stack_fffffffffffffdc0 = pvVar5->ffn_down_b;
    in_stack_fffffffffffffdd0 = (llm_graph_context *)0x0;
    in_stack_fffffffffffffdc8 = (ggml_tensor *)0x0;
    in_stack_fffffffffffffdb0 = (llama_hparams *)0x0;
    pgVar4 = llm_graph_context::build_ffn
                       ((llm_graph_context *)&stack0xfffffffffffffda8,pgVar15,pgVar14,pgVar10,
                        pgVar16,in_stack_fffffffffffffda8,gate_b,pgVar4,down,down_b,
                        in_stack_fffffffffffffe80,in_stack_fffffffffffffe88,
                        (llm_ffn_op_type)in_stack_fffffffffffffe90,type_gate,il_00);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
               &in_stack_fffffffffffffdb0->vocab_only,
               (int)((ulong)in_stack_fffffffffffffda8 >> 0x20));
    local_58 = (ggml_tensor *)
               ggml_add(*(undefined8 *)(in_RDI + 0xc0),pgVar4,in_stack_ffffffffffffff70);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
               &in_stack_fffffffffffffdb0->vocab_only,
               (int)((ulong)in_stack_fffffffffffffda8 >> 0x20));
  }
  pgVar4 = llm_graph_context::build_norm
                     (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
                      in_stack_fffffffffffffdb8,
                      (llm_norm_type)((ulong)in_stack_fffffffffffffdb0 >> 0x20),
                      (int)in_stack_fffffffffffffdb0);
  pgVar2 = pgVar4;
  llm_graph_context::cb
            ((llm_graph_context *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
             &in_stack_fffffffffffffdb0->vocab_only,iVar13);
  plVar11 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                      ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                       0x4f53e8);
  plVar11->t_embd = pgVar2;
  pgVar4 = llm_graph_context::build_lora_mm
                     ((llm_graph_context *)pgVar4,in_stack_fffffffffffffe08,pgVar2);
  llm_graph_context::cb
            ((llm_graph_context *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
             &in_stack_fffffffffffffdb0->vocab_only,iVar13);
  pgVar2 = pgVar4;
  plVar11 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                      ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                       0x4f546d);
  plVar11->t_logits = pgVar4;
  ggml_build_forward_expand(in_RCX,pgVar2);
  return;
}

Assistant:

llm_build_jais(const llama_model & model, const llm_graph_params & params, ggml_cgraph * gf) : llm_graph_context(params) {
        const int64_t n_embd_head = hparams.n_embd_head_v;
        const int64_t n_embd_gqa  = hparams.n_embd_v_gqa();

        GGML_ASSERT(n_embd_head == hparams.n_embd_head_k);

        ggml_tensor * cur;
        ggml_tensor * inpL;

        inpL = build_inp_embd(model.tok_embd);

        auto * inp_attn = build_attn_inp_kv_unified();

        for (int il = 0; il < n_layer; ++il) {
            cur = build_norm(inpL,
                    model.layers[il].attn_norm,
                    model.layers[il].attn_norm_b,
                    LLM_NORM, il);
            cb(cur, "attn_norm", il);

            // self-attention
            {
                cur = build_lora_mm(model.layers[il].wqkv, cur);
                cb(cur, "wqkv", il);

                cur = ggml_add(ctx0, cur, model.layers[il].bqkv);
                cb(cur, "bqkv", il);

                ggml_tensor * Qcur = ggml_cont(ctx0, ggml_view_2d(ctx0, cur, n_embd,     n_tokens, cur->nb[1], 0*cur->nb[0]*(n_embd)));
                ggml_tensor * Kcur = ggml_cont(ctx0, ggml_view_2d(ctx0, cur, n_embd_gqa, n_tokens, cur->nb[1], 1*cur->nb[0]*(n_embd)));
                ggml_tensor * Vcur = ggml_cont(ctx0, ggml_view_2d(ctx0, cur, n_embd_gqa, n_tokens, cur->nb[1], 1*cur->nb[0]*(n_embd + n_embd_gqa)));

                cb(Qcur, "Qcur", il);
                cb(Kcur, "Kcur", il);
                cb(Vcur, "Vcur", il);

                Qcur = ggml_reshape_3d(ctx0, Qcur, n_embd_head, n_head,    n_tokens);
                Kcur = ggml_reshape_3d(ctx0, Kcur, n_embd_head, n_head_kv, n_tokens);
                Vcur = ggml_reshape_3d(ctx0, Vcur, n_embd_head, n_head_kv, n_tokens);

                cur = build_attn(inp_attn, gf,
                        model.layers[il].wo, model.layers[il].bo,
                        Qcur, Kcur, Vcur, nullptr, nullptr, 1.0f/float(n_embd_head), il);
            }

            if (il == n_layer - 1) {
                // skip computing output for unused tokens
                ggml_tensor * inp_out_ids = build_inp_out_ids();
                cur  = ggml_get_rows(ctx0,  cur, inp_out_ids);
                inpL = ggml_get_rows(ctx0, inpL, inp_out_ids);
            }

            // add the input
            ggml_tensor * ffn_inp = ggml_add(ctx0, cur, inpL);
            cb(ffn_inp, "ffn_inp", il);

            // FF
            {
                cur = build_norm(ffn_inp,
                        model.layers[il].ffn_norm,
                        model.layers[il].ffn_norm_b,
                        LLM_NORM, il);
                cb(cur, "ffn_norm", il);

                cur = build_ffn(cur,
                        model.layers[il].ffn_up,   model.layers[il].ffn_up_b,   NULL,
                        model.layers[il].ffn_gate, model.layers[il].ffn_gate_b, NULL,
                        model.layers[il].ffn_down, model.layers[il].ffn_down_b, NULL,
                        NULL,
                        LLM_FFN_SILU, LLM_FFN_PAR, il);
                cb(cur, "ffn_out", il);
            }

            inpL = ggml_add(ctx0, cur, ffn_inp);
            cb(inpL, "l_out", il);
        }

        cur = build_norm(inpL,
                model.output_norm,
                model.output_norm_b,
                LLM_NORM, -1);

        cb(cur, "result_norm", -1);
        res->t_embd = cur;

        cur = build_lora_mm(model.output, cur);

        cb(cur, "result_output", -1);
        res->t_logits = cur;

        ggml_build_forward_expand(gf, cur);
    }